

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O3

int normal_scanRef(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte bVar1;
  char cVar2;
  XML_Convert_Result XVar3;
  ulong uVar4;
  char **ppcVar5;
  long lVar6;
  unsigned_short **ppuVar7;
  char *pcVar8;
  int iVar9;
  int iVar10;
  unsigned_short *in_R8;
  char **ppcVar11;
  
  ppcVar5 = (char **)(end + -(long)ptr);
  if ((long)ppcVar5 < 1) {
    return -1;
  }
  bVar1 = *(byte *)((long)enc[1].scanners + (ulong)(byte)*ptr);
  pcVar8 = (char *)(ulong)bVar1;
  iVar9 = 0;
  ppcVar11 = (char **)ptr;
  iVar10 = iVar9;
  if (bVar1 < 0x13) {
    if (bVar1 == 5) {
      if (ppcVar5 != (char **)0x1) {
        XVar3 = (*enc[3].scanners[1])(enc,ptr,pcVar8,ppcVar5);
        goto LAB_0055604b;
      }
      return -2;
    }
    if (bVar1 == 6) {
      if ((char **)0x2 < ppcVar5) {
        XVar3 = (*enc[3].scanners[2])(enc,ptr,pcVar8,ppcVar5);
        goto LAB_00556031;
      }
      return -2;
    }
    iVar10 = 0;
    if (bVar1 == 7) {
      if (ppcVar5 < (char **)0x4) {
        return -2;
      }
      XVar3 = (*enc[3].literalScanners[0])(enc,ptr,pcVar8,ppcVar5);
      while( true ) {
        lVar6 = 4;
        while( true ) {
          while( true ) {
            ppcVar11 = (char **)ptr;
            iVar10 = iVar9;
            if (XVar3 == XML_CONVERT_COMPLETED) goto LAB_00556058;
LAB_00555fb5:
            while( true ) {
              ptr = (char *)((long)ptr + lVar6);
              uVar4 = (long)end - (long)ptr;
              if ((long)uVar4 < 1) {
                return -1;
              }
              ppuVar7 = (unsigned_short **)(ulong)(byte)*ptr;
              bVar1 = *(byte *)((long)enc[1].scanners + (long)ppuVar7);
              ppcVar11 = (char **)ptr;
              if (bVar1 < 0x12) break;
              lVar6 = 1;
              if ((3 < bVar1 - 0x18) && (bVar1 != 0x16)) {
                iVar10 = iVar9;
                if (bVar1 == 0x12) {
                  ppcVar11 = (char **)((long)ptr + 1);
                  iVar10 = 9;
                }
                goto LAB_00556058;
              }
            }
            if (bVar1 != 5) break;
            if (uVar4 == 1) {
              return -2;
            }
            XVar3 = (*enc[2].utf16Convert)(enc,(char **)ptr,(char *)(ulong)bVar1,ppuVar7,in_R8);
LAB_0055604b:
            lVar6 = 2;
          }
          if (bVar1 != 6) break;
          if (uVar4 < 3) {
            return -2;
          }
          XVar3 = (**(code **)&enc[2].minBytesPerChar)(enc,ptr);
LAB_00556031:
          lVar6 = 3;
        }
        iVar10 = iVar9;
        if (bVar1 != 7) break;
        if (uVar4 < 4) {
          return -2;
        }
        XVar3 = (*enc[3].scanners[0])(enc,ptr,(char *)(ulong)bVar1,(char **)ppuVar7);
      }
    }
  }
  else if (bVar1 == 0x13) {
    ppcVar11 = (char **)(ptr + 1);
    if ((char **)end == ppcVar11 || (long)end - (long)ppcVar11 < 0) {
      return -1;
    }
    if ((ulong)*(byte *)ppcVar11 == 0x78) {
      ppcVar11 = (char **)(ptr + 2);
      if ((char **)end == ppcVar11 || (long)end - (long)ppcVar11 < 0) {
        return -1;
      }
      if ((*(byte *)((long)enc[1].scanners + (ulong)*(byte *)ppcVar11) & 0xfe) != 0x18)
      goto LAB_00556058;
      ppcVar11 = (char **)(ptr + 3);
      lVar6 = (long)end - (long)ppcVar11;
      while( true ) {
        if (lVar6 < 1) {
          return -1;
        }
        bVar1 = *(byte *)((long)enc[1].scanners + (ulong)*(byte *)ppcVar11);
        if (1 < bVar1 - 0x18) break;
        ppcVar11 = (char **)((long)ppcVar11 + 1);
        lVar6 = lVar6 + -1;
      }
      if (bVar1 != 0x12) goto LAB_00556058;
      ppcVar5 = (char **)((long)ppcVar11 + 1);
    }
    else {
      if (*(char *)((long)enc[1].scanners + (ulong)*(byte *)ppcVar11) != '\x19') goto LAB_00556058;
      lVar6 = (long)ppcVar5 + -2;
      ppcVar5 = (char **)(ptr + 2);
      do {
        ppcVar11 = ppcVar5;
        if (lVar6 < 1) {
          return -1;
        }
        cVar2 = *(char *)((long)enc[1].scanners + (ulong)*(byte *)ppcVar11);
        ppcVar5 = (char **)((long)ppcVar11 + 1);
        lVar6 = lVar6 + -1;
      } while (cVar2 == '\x19');
      if (cVar2 != '\x12') goto LAB_00556058;
    }
    ppcVar11 = ppcVar5;
    iVar10 = 10;
  }
  else {
    lVar6 = 1;
    if (bVar1 == 0x16) goto LAB_00555fb5;
    if (bVar1 == 0x18) goto LAB_00555fb5;
  }
LAB_00556058:
  *nextTokPtr = (char *)ppcVar11;
  return iVar10;
}

Assistant:

static int PTRCALL
PREFIX(scanRef)(const ENCODING *enc, const char *ptr, const char *end,
                const char **nextTokPtr)
{
  REQUIRE_CHAR(enc, ptr, end);
  switch (BYTE_TYPE(enc, ptr)) {
  CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
  case BT_NUM:
    return PREFIX(scanCharRef)(enc, ptr + MINBPC(enc), end, nextTokPtr);
  default:
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  }
  while (HAS_CHAR(enc, ptr, end)) {
    switch (BYTE_TYPE(enc, ptr)) {
    CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
    case BT_SEMI:
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_ENTITY_REF;
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  return XML_TOK_PARTIAL;
}